

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O3

void wabt::cat_concatenate<std::__cxx11::string,char[2],char_const*>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               char (*args) [2],char **args_1)

{
  std::__cxx11::string::_M_append((char *)s,(ulong)(t->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)s);
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
  s += t;
  cat_concatenate(s, args...);
}